

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonteCarloPricer.h
# Opt level: O1

void __thiscall
MonteCarloPricer::priceAndPrint<AsianArithmeticPut>
          (MonteCarloPricer *this,BlackScholesModel *model,AsianArithmeticPut *option)

{
  long *plVar1;
  PriceCI local_40;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  BlackScholesModel::print(model);
  (**(option->super_PathDependentOption).super_Option._vptr_Option)(option);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," Number of paths: ",0x12);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->num_sims);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," Number of steps: ",0x12);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->n_steps);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  price<AsianArithmeticPut>(&local_40,this,model,option);
  PriceCI::print_CI(&local_40);
  return;
}

Assistant:

inline void MonteCarloPricer::priceAndPrint(BlackScholesModel const& model, T const& option)
{
	std::cout << std::endl;
	model.print();
	option.print();
	std::cout << " Number of paths: " << num_sims << std::endl;
	std::cout << " Number of steps: " << n_steps << std::endl;
	price(model, option).print_CI();
}